

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ctrlvec_load_prompt_file(string *path,bool skip_empty_lines)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  value_type *__x;
  byte in_DL;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool is_skip;
  string line;
  ifstream file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  byte local_28a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  FILE *__stream;
  string local_250 [48];
  istream local_220 [526];
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x17bb81);
  std::ifstream::ifstream(local_220,(string *)in_RSI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_250);
    while( true ) {
      __x = (value_type *)
            std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(&__x->_M_dataplus + *(long *)(*(long *)__x + -0x18)));
      if (!bVar2) break;
      local_28a = 0;
      if ((local_11 & 1) != 0) {
        local_28a = std::__cxx11::string::empty();
      }
      if ((local_28a & 1) == 0) {
        string_process_escapes(in_RSI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd80,__x);
      }
    }
    std::ifstream::close();
    local_12 = 1;
    std::__cxx11::string::~string(local_250);
    std::ifstream::~ifstream(local_220);
    if ((local_12 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd80);
    }
    return in_RDI;
  }
  __stream = _stderr;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(__stream,"error: unable to open file: %s\n",uVar3);
  exit(1);
}

Assistant:

static std::vector<std::string> ctrlvec_load_prompt_file(std::string path, bool skip_empty_lines) {
    std::vector<std::string> output;
    std::ifstream file(path);
    if (!file.is_open()) {
        fprintf(stderr, "error: unable to open file: %s\n", path.c_str());
        exit(1);
    }
    std::string line;
    while (std::getline(file, line)) {
        bool is_skip = skip_empty_lines && line.empty();
        if (!is_skip) {
            string_process_escapes(line);
            output.push_back(line);
        }
    }
    file.close();
    return output;
}